

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  int iVar1;
  bool local_59;
  undefined1 local_58 [8];
  Walker w;
  u16 savedHasAgg;
  Expr *pExpr_local;
  NameContext *pNC_local;
  
  if (pExpr == (Expr *)0x0) {
    pNC_local._4_4_ = 0;
  }
  else {
    w.u._6_2_ = pNC->ncFlags & 0x9010;
    pNC->ncFlags = pNC->ncFlags & 0x6fef;
    local_58 = (undefined1  [8])pNC->pParse;
    w.pParse = (Parse *)resolveExprStep;
    w.xExprCallback = resolveSelectStep;
    w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    ((Parse *)local_58)->nHeight = pExpr->nHeight + ((Parse *)local_58)->nHeight;
    w._32_8_ = pNC;
    iVar1 = sqlite3ExprCheckHeight((Parse *)local_58,((Parse *)local_58)->nHeight);
    if (iVar1 == 0) {
      sqlite3WalkExpr((Walker *)local_58,pExpr);
      *(int *)((long)local_58 + 0x11c) = *(int *)((long)local_58 + 0x11c) - pExpr->nHeight;
      pExpr->flags = pNC->ncFlags & 0x8010 | pExpr->flags;
      pNC->ncFlags = pNC->ncFlags | w.u._6_2_;
      local_59 = true;
      if (pNC->nErr < 1) {
        local_59 = 0 < *(int *)((long)local_58 + 0x30);
      }
      pNC_local._4_4_ = (uint)local_59;
    }
    else {
      pNC_local._4_4_ = 1;
    }
  }
  return pNC_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames( 
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  u16 savedHasAgg;
  Walker w;

  if( pExpr==0 ) return SQLITE_OK;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight += pExpr->nHeight;
  if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
    return SQLITE_ERROR;
  }
#endif
  sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight -= pExpr->nHeight;
#endif
  assert( EP_Agg==NC_HasAgg );
  assert( EP_Win==NC_HasWin );
  testcase( pNC->ncFlags & NC_HasAgg );
  testcase( pNC->ncFlags & NC_HasWin );
  ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
  pNC->ncFlags |= savedHasAgg;
  return pNC->nErr>0 || w.pParse->nErr>0;
}